

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat_pixel.cpp
# Opt level: O0

Mat * ncnn::Mat::from_pixels_resize
                (uchar *pixels,int type,int w,int h,int stride,int target_width,int target_height,
                Allocator *allocator)

{
  Allocator *allocator_00;
  int in_ECX;
  uint in_EDX;
  undefined8 in_RSI;
  Mat *in_RDI;
  int in_R8D;
  int in_stack_00000008;
  int in_stack_00000010;
  int in_stack_00000034;
  uchar *in_stack_00000038;
  int in_stack_00000044;
  int in_stack_00000048;
  int in_stack_0000004c;
  uchar *in_stack_00000050;
  int in_stack_00000060;
  int in_stack_00000068;
  Mat dst_2;
  Mat dst_1;
  Mat dst;
  int type_from;
  undefined8 in_stack_fffffffffffffe38;
  int _elempack;
  undefined4 in_stack_fffffffffffffe40;
  undefined4 in_stack_fffffffffffffe44;
  int in_stack_fffffffffffffe48;
  int in_stack_fffffffffffffe4c;
  Mat *in_stack_fffffffffffffe50;
  undefined8 in_stack_fffffffffffffe58;
  int iVar1;
  Mat *this;
  undefined8 in_stack_fffffffffffffe60;
  int in_stack_fffffffffffffe68;
  int in_stack_fffffffffffffe6c;
  int in_stack_fffffffffffffe70;
  int in_stack_fffffffffffffe74;
  uchar *in_stack_fffffffffffffe78;
  Allocator *in_stack_fffffffffffffe90;
  Mat local_110;
  Mat local_c8;
  Mat local_70;
  uint local_24;
  int local_18;
  undefined8 local_10;
  
  iVar1 = (int)((ulong)in_stack_fffffffffffffe58 >> 0x20);
  if ((in_ECX == in_stack_00000008) && (in_R8D == in_stack_00000010)) {
    from_pixels(in_stack_fffffffffffffe78,in_stack_fffffffffffffe74,in_stack_fffffffffffffe70,
                in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68,in_stack_fffffffffffffe90);
  }
  else {
    local_24 = in_EDX & 0xffff;
    _elempack = (int)((ulong)in_stack_fffffffffffffe38 >> 0x20);
    if ((local_24 == 1) || (local_24 == 2)) {
      Mat(in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48,
          CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),_elempack,
          (Allocator *)0x151e20);
      operator_cast_to_unsigned_char_(&local_70);
      resize_bilinear_c3(in_stack_00000050,in_stack_0000004c,in_stack_00000048,in_stack_00000044,
                         in_stack_00000038,in_stack_00000034,in_stack_00000060,in_stack_00000068);
      operator_cast_to_unsigned_char_(&local_70);
      from_pixels((uchar *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
                  (int)((ulong)in_stack_fffffffffffffe60 >> 0x20),(int)in_stack_fffffffffffffe60,
                  iVar1,(Allocator *)in_stack_fffffffffffffe50);
      ~Mat((Mat *)0x151f11);
    }
    else if (local_24 == 3) {
      Mat(in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48,
          CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),_elempack,
          (Allocator *)0x151f7a);
      operator_cast_to_unsigned_char_(&local_c8);
      resize_bilinear_c1(in_stack_00000050,in_stack_0000004c,in_stack_00000048,in_stack_00000044,
                         in_stack_00000038,in_stack_00000034,in_stack_00000060,in_stack_00000068);
      operator_cast_to_unsigned_char_(&local_c8);
      from_pixels((uchar *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
                  (int)((ulong)in_stack_fffffffffffffe60 >> 0x20),(int)in_stack_fffffffffffffe60,
                  iVar1,(Allocator *)in_stack_fffffffffffffe50);
      ~Mat((Mat *)0x152043);
    }
    else if ((local_24 == 4) || (local_24 == 5)) {
      this = &local_110;
      local_18 = in_ECX;
      local_10 = in_RSI;
      Mat(in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48,
          CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),_elempack,
          (Allocator *)0x1520b6);
      operator_cast_to_unsigned_char_(this);
      iVar1 = (int)((ulong)this >> 0x20);
      resize_bilinear_c4(in_stack_00000050,in_stack_0000004c,in_stack_00000048,in_stack_00000044,
                         in_stack_00000038,in_stack_00000034,in_stack_00000060,in_stack_00000068);
      allocator_00 = (Allocator *)operator_cast_to_unsigned_char_(&local_110);
      from_pixels((uchar *)CONCAT44(local_18,in_stack_fffffffffffffe68),
                  (int)((ulong)local_10 >> 0x20),(int)local_10,iVar1,allocator_00);
      ~Mat((Mat *)0x152186);
    }
    else {
      fprintf(_stderr,"unknown convert type %d",(ulong)in_EDX);
      fprintf(_stderr,"\n");
      Mat(in_RDI);
    }
  }
  return in_RDI;
}

Assistant:

Mat Mat::from_pixels_resize(const unsigned char* pixels, int type, int w, int h, int stride, int target_width, int target_height, Allocator* allocator)
{
    if (w == target_width && h == target_height)
        return Mat::from_pixels(pixels, type, w, h, stride, allocator);

    int type_from = type & PIXEL_FORMAT_MASK;

    if (type_from == PIXEL_RGB || type_from == PIXEL_BGR)
    {
        Mat dst(target_width, target_height, (size_t)3u, 3);
        resize_bilinear_c3(pixels, w, h, stride, dst, target_width, target_height, target_width * 3);

        return Mat::from_pixels(dst, type, target_width, target_height, allocator);
    }
    else if (type_from == PIXEL_GRAY)
    {
        Mat dst(target_width, target_height, (size_t)1u, 1);
        resize_bilinear_c1(pixels, w, h, stride, dst, target_width, target_height, target_width * 1);

        return Mat::from_pixels(dst, type, target_width, target_height, allocator);
    }
    else if (type_from == PIXEL_RGBA || type_from == PIXEL_BGRA)
    {
        Mat dst(target_width, target_height, (size_t)4u, 4);
        resize_bilinear_c4(pixels, w, h, stride, dst, target_width, target_height, target_width * 4);

        return Mat::from_pixels(dst, type, target_width, target_height, allocator);
    }

    // unknown convert type
    NCNN_LOGE("unknown convert type %d", type);
    return Mat();
}